

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O2

box3f * __thiscall
pbrt::Sphere::getPrimBounds(box3f *__return_storage_ptr__,Sphere *this,size_t param_1,affine3f *xfm)

{
  vec3f vVar1;
  affine3f _xfm;
  vec3f local_90;
  vec3f local_84;
  float local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined1 local_68 [16];
  affine3f local_50;
  
  local_68 = ZEXT416((uint)this->radius);
  local_78 = -this->radius;
  uStack_74 = 0x80000000;
  uStack_70 = 0x80000000;
  uStack_6c = 0x80000000;
  math::operator*(&local_50,xfm,&this->transform);
  (__return_storage_ptr__->lower).x = 3.4028235e+38;
  (__return_storage_ptr__->lower).y = 3.4028235e+38;
  *(undefined8 *)&(__return_storage_ptr__->lower).z = 0xff7fffff7f7fffff;
  (__return_storage_ptr__->upper).y = -3.4028235e+38;
  (__return_storage_ptr__->upper).z = -3.4028235e+38;
  local_84.x = local_78;
  local_84.y = local_78;
  local_84.z = local_78;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  local_84.x = local_78;
  local_84.y = local_78;
  local_84.z = (float)local_68._0_4_;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  local_84.x = local_78;
  local_84.y = (float)local_68._0_4_;
  local_84.z = local_78;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  local_84.x = local_78;
  local_84.y = (float)local_68._0_4_;
  local_84.z = (float)local_68._0_4_;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  local_84.x = (float)local_68._0_4_;
  local_84.y = local_78;
  local_84.z = local_78;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  local_84.x = (float)local_68._0_4_;
  local_84.y = local_78;
  local_84.z = (float)local_68._0_4_;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  local_84.x = (float)local_68._0_4_;
  local_84.y = (float)local_68._0_4_;
  local_84.z = local_78;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  local_84.x = (float)local_68._0_4_;
  local_84.y = (float)local_68._0_4_;
  local_84.z = (float)local_68._0_4_;
  vVar1 = math::operator*(&local_50,&local_84);
  local_90.z = vVar1.z;
  local_90._0_8_ = vVar1._0_8_;
  math::box3f::extend(__return_storage_ptr__,&local_90);
  return __return_storage_ptr__;
}

Assistant:

box3f Sphere::getPrimBounds(const size_t /*unused: primID*/, const affine3f &xfm) 
  {
    box3f ob(vec3f(-radius),vec3f(+radius));
    affine3f _xfm = xfm * transform;
      
    box3f bounds = box3f::empty_box();
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.lower.x,ob.upper.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.lower.y,ob.upper.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.lower.z)));
    bounds.extend(xfmPoint(_xfm,vec3f(ob.upper.x,ob.upper.y,ob.upper.z)));
    return bounds;
  }